

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O3

Gia_Man_t * Abc_NtkHieCecTest(char *pFileName,int fVerbose)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  Gia_Man_t *pGVar2;
  long lVar3;
  int level;
  long lVar4;
  timespec ts;
  timespec local_30;
  
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  pNtk = Io_ReadBlifMv(pFileName,0,1);
  if (pNtk == (Abc_Ntk_t *)0x0) {
    puts("Reading BLIF file has failed.");
    pGVar2 = (Gia_Man_t *)0x0;
  }
  else {
    if ((pNtk->pDesign == (Abc_Des_t *)0x0) || (pNtk->pDesign->vModules == (Vec_Ptr_t *)0x0)) {
      puts("There is no hierarchy information.");
    }
    level = 3;
    iVar1 = clock_gettime(3,&local_30);
    if (iVar1 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    Abc_Print(level,"%s =","Reading file");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
    if (pNtk->ntkType != ABC_NTK_NETLIST) {
      __assert_fail("Abc_NtkIsNetlist(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieCec.c"
                    ,0x2b2,"Gia_Man_t *Abc_NtkHieCecTest(char *, int)");
    }
    if (pNtk->nObjCounts[8] != 0) {
      __assert_fail("!Abc_NtkLatchNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieCec.c"
                    ,0x2b3,"Gia_Man_t *Abc_NtkHieCecTest(char *, int)");
    }
    if (fVerbose != 0) {
      Abc_NtkPrintBoxInfo(pNtk);
    }
    pGVar2 = Au_ManDeriveTest(pNtk);
    Abc_NtkDelete(pNtk);
  }
  return pGVar2;
}

Assistant:

Gia_Man_t * Abc_NtkHieCecTest( char * pFileName, int fVerbose )
{
    int fUseTest = 1;
    int fUseNew = 0;
    int fCheck = 1;
    Vec_Ptr_t * vMods, * vOrder;
    Abc_Ntk_t * pNtk, * pModel;
    Gia_Man_t * pGia;
    int i;
    abctime clk = Abc_Clock();

    // read hierarchical netlist
    pNtk = Io_ReadBlifMv( pFileName, 0, fCheck );
    if ( pNtk == NULL )
    {
        printf( "Reading BLIF file has failed.\n" );
        return NULL;
    }
    if ( pNtk->pDesign == NULL || pNtk->pDesign->vModules == NULL )
    {
        printf( "There is no hierarchy information.\n" );
//        Abc_NtkDelete( pNtk );
//        return NULL;
    }
    Abc_PrintTime( 1, "Reading file", Abc_Clock() - clk );

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( !Abc_NtkLatchNum(pNtk) );
/*
    if ( pNtk->pDesign != NULL )
    {
        clk = Abc_Clock();
        Abc_NtkCountNodes( pNtk );
        Abc_PrintTime( 1, "Count nodes", Abc_Clock() - clk );
    }
*/
    // print stats
    if ( fVerbose )
        Abc_NtkPrintBoxInfo( pNtk );

    // test the new data-structure
    if ( fUseTest )
    {
        extern Gia_Man_t * Au_ManDeriveTest( Abc_Ntk_t * pRoot );
        Gia_Man_t * pGia;
        pGia = Au_ManDeriveTest( pNtk );
        Abc_NtkDelete( pNtk );
        return pGia;
    }

    if ( Abc_NtkCheckRecursive(pNtk) )
        return NULL;

    if ( fUseNew )
    {
        clk = Abc_Clock();
        vOrder = Abc_NtkCollectHie( pNtk );
        Abc_PrintTime( 1, "Collect DFS ", Abc_Clock() - clk );

        // derive GIA
        clk = Abc_Clock();
        pGia = Abc_NtkDeriveFlatGia2( pNtk, vOrder );
        Abc_PrintTime( 1, "Deriving GIA", Abc_Clock() - clk );
        Gia_ManPrintStats( pGia, NULL );
    //    Gia_ManStop( pGia );
 
        Vec_PtrFree( vOrder );
    }
    else
    {
        // order nodes/boxes of all models
        vMods = pNtk->pDesign->vModules;
        Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
            pModel->pData = Abc_NtkDfsBoxes( pModel );

        // derive GIA
        clk = Abc_Clock();
        pGia = Abc_NtkDeriveFlatGia( pNtk );
        Abc_PrintTime( 1, "Deriving GIA", Abc_Clock() - clk );
        Gia_ManPrintStats( pGia, NULL );

        // clean nodes/boxes of all nodes
        Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
            Vec_PtrFree( (Vec_Ptr_t *)pModel->pData );
    }

    clk = Abc_Clock();
    Abc_NtkCountInst( pNtk );
    Abc_PrintTime( 1, "Gather stats", Abc_Clock() - clk );

    Abc_NtkDelete( pNtk );
    return pGia;
}